

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  long in_FS_OFFSET;
  int sizes [17];
  int next_code [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  int aiStack_68 [16];
  
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_78 = 0;
  memset(z,0,0x400);
  if (0 < num) {
    uVar6 = 0;
    do {
      piVar1 = (int *)((long)&local_b8 + (ulong)sizelist[uVar6] * 4);
      *piVar1 = *piVar1 + 1;
      uVar6 = uVar6 + 1;
    } while ((uint)num != uVar6);
  }
  local_b8 = local_b8 & 0xffffffff00000000;
  lVar7 = 1;
  pcVar9 = "bad sizes";
  do {
    if (1 << ((byte)lVar7 & 0x1f) < *(int *)((long)&local_b8 + lVar7 * 4)) goto LAB_001343d5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x10);
  lVar7 = 0;
  bVar3 = 0xf;
  pcVar9 = "bad codelengths";
  iVar10 = 0;
  iVar11 = 0;
  while( true ) {
    aiStack_68[lVar7 + 1] = iVar11;
    z->firstcode[lVar7 + 1] = (stbi__uint16)iVar11;
    z->firstsymbol[lVar7 + 1] = (stbi__uint16)iVar10;
    iVar2 = *(int *)((long)&local_b8 + lVar7 * 4 + 4);
    iVar11 = iVar11 + iVar2;
    if ((iVar2 != 0) && (1 << ((char)lVar7 + 1U & 0x1f) < iVar11)) break;
    z->maxcode[lVar7 + 1] = iVar11 << (bVar3 & 0x1f);
    iVar11 = iVar11 * 2;
    iVar10 = iVar10 + iVar2;
    bVar3 = bVar3 - 1;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0xf) {
      z->maxcode[0x10] = 0x10000;
      if (0 < num) {
        uVar6 = 0;
        do {
          bVar3 = sizelist[uVar6];
          if (bVar3 != 0) {
            iVar11 = aiStack_68[bVar3];
            lVar7 = (long)(int)(iVar11 - (uint)z->firstcode[bVar3]) + (ulong)z->firstsymbol[bVar3];
            z->size[lVar7] = bVar3;
            z->value[lVar7] = (ushort)uVar6;
            if ((bVar3 < 10) &&
               (uVar4 = (ushort)iVar11 << 8 | (ushort)iVar11 >> 8,
               uVar5 = (uVar4 & 0xf0f) << 4 | (uVar4 & 0xf0f0) >> 4,
               uVar5 = (uVar5 >> 2 & 0x3333) + (uVar5 & 0x3333) * 4,
               uVar5 = (uVar5 >> 1 & 0x5555) + (uVar5 & 0x5555) * 2 >> (0x10 - bVar3 & 0x1f),
               uVar5 < 0x200)) {
              uVar8 = (ulong)uVar5;
              do {
                z->fast[uVar8] = (ushort)uVar6 | (ushort)bVar3 << 9;
                uVar8 = uVar8 + (1L << (bVar3 & 0x3f));
              } while (uVar8 < 0x200);
            }
            aiStack_68[bVar3] = iVar11 + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)num);
      }
      return 1;
    }
  }
LAB_001343d5:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}